

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution_random.cpp
# Opt level: O0

void solve_random(void)

{
  clock_t cVar1;
  reference ppCVar2;
  iterator __first;
  iterator __last;
  reference ppVVar3;
  Video *video;
  int i;
  undefined1 local_30 [8];
  vector<Video_*,_std::allocator<Video_*>_> v;
  Cache *cache;
  int cache_id;
  
  cVar1 = clock();
  srand((uint)cVar1);
  for (; cache._4_4_ < num_caches; cache._4_4_ = cache._4_4_ + 1) {
    ppCVar2 = std::vector<Cache_*,_std::allocator<Cache_*>_>::operator[](&caches,(long)cache._4_4_);
    v.super__Vector_base<Video_*,_std::allocator<Video_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*ppCVar2;
    std::vector<Video_*,_std::allocator<Video_*>_>::vector
              ((vector<Video_*,_std::allocator<Video_*>_> *)local_30,&videos);
    __first = std::vector<Video_*,_std::allocator<Video_*>_>::begin
                        ((vector<Video_*,_std::allocator<Video_*>_> *)local_30);
    __last = std::vector<Video_*,_std::allocator<Video_*>_>::end
                       ((vector<Video_*,_std::allocator<Video_*>_> *)local_30);
    std::
    random_shuffle<__gnu_cxx::__normal_iterator<Video**,std::vector<Video*,std::allocator<Video*>>>>
              ((__normal_iterator<Video_**,_std::vector<Video_*,_std::allocator<Video_*>_>_>)
               __first._M_current,
               (__normal_iterator<Video_**,_std::vector<Video_*,_std::allocator<Video_*>_>_>)
               __last._M_current);
    for (video._0_4_ = 0; (int)video < num_videos; video._0_4_ = (int)video + 1) {
      ppVVar3 = std::vector<Video_*,_std::allocator<Video_*>_>::operator[]
                          ((vector<Video_*,_std::allocator<Video_*>_> *)local_30,(long)(int)video);
      if ((*ppVVar3)->size <=
          *(int *)(v.super__Vector_base<Video_*,_std::allocator<Video_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 0x15)) {
        Cache::add_video((Cache *)v.super__Vector_base<Video_*,_std::allocator<Video_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,*ppVVar3);
      }
    }
    std::vector<Video_*,_std::allocator<Video_*>_>::~vector
              ((vector<Video_*,_std::allocator<Video_*>_> *)local_30);
  }
  return;
}

Assistant:

void solve_random() {
    srand(clock());

    for (int cache_id; cache_id < num_caches; ++cache_id) {
        Cache *cache = caches[cache_id];
        vector<Video *> v = videos;
        random_shuffle(v.begin(), v.end());
        for (int i = 0; i < num_videos; ++i) {
            Video *video = v[i];
            if (cache->remaining >= video->size) {
                cache->add_video(video);
            }
        }
    }
}